

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall t_php_generator::generate_service_rest(t_php_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *this_00;
  int *piVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar3;
  pointer pptVar4;
  t_type *type;
  undefined4 extraout_var_01;
  int __oflag;
  pointer pptVar5;
  string *this_01;
  string req;
  string cast;
  string extends_if;
  string extends;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  t_struct *local_b0;
  string local_a8;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_88;
  string local_70;
  string local_50;
  
  this_00 = &this->f_service_;
  if (this->classmap_ == false) {
    std::operator+(&local_f0,&this->package_dir_,
                   &(this->super_t_oop_generator).super_t_generator.service_name_);
    std::operator+(&local_d0,&local_f0,"Rest.php");
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string
              ((string *)&local_f0,local_d0._M_dataplus._M_p,(allocator *)&local_110);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (this_00,(char *)&local_f0,__oflag);
    std::__cxx11::string::~string((string *)&local_f0);
    generate_service_header(this,tservice,(ostream *)this_00);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::string((string *)&local_d0,"",(allocator *)&local_f0);
  std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&local_110);
  if (tservice->extends_ != (t_service *)0x0) {
    php_namespace_abi_cxx11_(&local_130,this,(tservice->extends_->super_t_type).program_);
    std::operator+(&local_150," extends ",&local_130);
    iVar2 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_110,&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    php_namespace_abi_cxx11_(&local_a8,this,(tservice->extends_->super_t_type).program_);
    std::operator+(&local_130," extends ",&local_a8);
    iVar2 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_150,&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar2));
    std::operator+(&local_110,&local_150,"Rest");
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  poVar3 = std::operator<<((ostream *)this_00,"class ");
  poVar3 = std::operator<<(poVar3,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar3 = std::operator<<(poVar3,"Rest");
  poVar3 = std::operator<<(poVar3,(string *)&local_f0);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if (local_d0._M_string_length == 0) {
    t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)this_00,(string *)&local_110);
    poVar3 = std::operator<<(poVar3,"protected $impl_;");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_110);
  }
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)this_00,(string *)&local_110);
  poVar3 = std::operator<<(poVar3,"public function __construct($impl) {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_150);
  poVar3 = std::operator<<(poVar3,"  $this->impl_ = $impl;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_130);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_110);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_88,&tservice->functions_)
  ;
  pptVar4 = local_88._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pptVar4 == local_88._M_impl.super__Vector_impl_data._M_finish) {
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar3 = std::operator<<((ostream *)this_00,"}");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      iVar2 = 0x36c6b8;
      std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
      if (this->classmap_ == false) {
        template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
        close(this_00,iVar2);
      }
      std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_88);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      return;
    }
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)this_00);
    poVar3 = std::operator<<(poVar3,"public function ");
    poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
    poVar3 = std::operator<<(poVar3,"($request) {");
    this_01 = &::endl_abi_cxx11_;
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    local_b0 = (*pptVar4)->arglist_;
    for (pptVar5 = (local_b0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar5 !=
        (local_b0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      type = t_type::get_true_type((*pptVar5)->type_);
      type_to_cast_abi_cxx11_(&local_110,(t_php_generator *)this_01,type);
      std::operator+(&local_130,"$request[\'",&(*pptVar5)->name_);
      std::operator+(&local_150,&local_130,"\']");
      std::__cxx11::string::~string((string *)&local_130);
      iVar2 = (*(type->super_t_doc)._vptr_t_doc[8])(type);
      if ((char)iVar2 == '\0') {
        t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
        poVar3 = std::operator<<((ostream *)this_00,(string *)&local_130);
        poVar3 = std::operator<<(poVar3,"$");
        poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
        poVar3 = std::operator<<(poVar3," = isset(");
        poVar3 = std::operator<<(poVar3,(string *)&local_150);
        poVar3 = std::operator<<(poVar3,") ? ");
        poVar3 = std::operator<<(poVar3,(string *)&local_110);
        poVar3 = std::operator<<(poVar3,(string *)&local_150);
        poVar3 = std::operator<<(poVar3," : null;");
        this_01 = &::endl_abi_cxx11_;
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
        poVar3 = std::operator<<((ostream *)this_00,(string *)&local_130);
        poVar3 = std::operator<<(poVar3,"$");
        poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
        poVar3 = std::operator<<(poVar3," = ");
        poVar3 = std::operator<<(poVar3,(string *)&local_110);
        poVar3 = std::operator<<(poVar3,"(!empty(");
        poVar3 = std::operator<<(poVar3,(string *)&local_150);
        poVar3 = std::operator<<(poVar3,") && (");
        poVar3 = std::operator<<(poVar3,(string *)&local_150);
        poVar3 = std::operator<<(poVar3," !== \'false\'));");
        this_01 = &::endl_abi_cxx11_;
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&local_130);
      iVar2 = (*(type->super_t_doc)._vptr_t_doc[6])(type);
      if ((((char)iVar2 == '\0') ||
          (*(char *)((long)&type[1].super_t_doc._vptr_t_doc + 4) != '\x01')) ||
         (*(int *)&type[1].super_t_doc._vptr_t_doc != 1)) {
        iVar2 = (*(type->super_t_doc)._vptr_t_doc[0x10])(type);
        if ((char)iVar2 != '\0') {
LAB_00276197:
          t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
          poVar3 = std::operator<<((ostream *)this_00,(string *)&local_130);
          poVar3 = std::operator<<(poVar3,"$");
          poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
          poVar3 = std::operator<<(poVar3," = json_decode($");
          poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
          poVar3 = std::operator<<(poVar3,", true);");
          this_01 = &::endl_abi_cxx11_;
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          goto LAB_0027620c;
        }
        iVar2 = (*(type->super_t_doc)._vptr_t_doc[0xe])(type);
        if ((char)iVar2 != '\0') goto LAB_00276197;
        iVar2 = (*(type->super_t_doc)._vptr_t_doc[0xf])(type);
        if ((char)iVar2 != '\0') {
          t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
          poVar3 = std::operator<<((ostream *)this_00,(string *)&local_130);
          poVar3 = std::operator<<(poVar3,"$");
          poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
          poVar3 = std::operator<<(poVar3," = array_fill_keys(json_decode($");
          poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
          poVar3 = std::operator<<(poVar3,", true), 1);");
          this_01 = &::endl_abi_cxx11_;
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          goto LAB_0027620c;
        }
        iVar2 = (*(type->super_t_doc)._vptr_t_doc[0xb])(type);
        if ((char)iVar2 != '\0') {
LAB_002762d7:
          t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
          poVar3 = std::operator<<((ostream *)this_00,(string *)&local_130);
          poVar3 = std::operator<<(poVar3,"if ($");
          poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
          poVar3 = std::operator<<(poVar3," !== null) {");
          poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
          poVar3 = std::operator<<(poVar3,(string *)&local_a8);
          poVar3 = std::operator<<(poVar3,"  $");
          poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
          poVar3 = std::operator<<(poVar3," = new ");
          php_namespace_abi_cxx11_(&local_50,this,type->program_);
          poVar3 = std::operator<<(poVar3,(string *)&local_50);
          iVar2 = (*(type->super_t_doc)._vptr_t_doc[3])(type);
          poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_01,iVar2));
          poVar3 = std::operator<<(poVar3,"(json_decode($");
          poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
          poVar3 = std::operator<<(poVar3,", true));");
          poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
          poVar3 = std::operator<<(poVar3,(string *)&local_70);
          poVar3 = std::operator<<(poVar3,"}");
          this_01 = &::endl_abi_cxx11_;
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_a8);
          goto LAB_0027620c;
        }
        iVar2 = (*(type->super_t_doc)._vptr_t_doc[0xc])(type);
        if ((char)iVar2 != '\0') goto LAB_002762d7;
      }
      else {
        t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
        poVar3 = std::operator<<((ostream *)this_00,(string *)&local_130);
        poVar3 = std::operator<<(poVar3,"$");
        poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
        poVar3 = std::operator<<(poVar3," = explode(\',\', $");
        poVar3 = std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
        poVar3 = std::operator<<(poVar3,");");
        this_01 = &::endl_abi_cxx11_;
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
LAB_0027620c:
        std::__cxx11::string::~string((string *)&local_130);
      }
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_110);
    }
    t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)this_00,(string *)&local_110);
    poVar3 = std::operator<<(poVar3,"return $this->impl_->");
    poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
    poVar3 = std::operator<<(poVar3,"(");
    argument_list_abi_cxx11_(&local_150,this,(*pptVar4)->arglist_,false);
    poVar3 = std::operator<<(poVar3,(string *)&local_150);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_110);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)this_00);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    pptVar4 = pptVar4 + 1;
  } while( true );
}

Assistant:

void t_php_generator::generate_service_rest(t_service* tservice) {
  ofstream_with_content_based_conditional_update& f_service_rest = f_service_;
  if (!classmap_) {
    string f_service_rest_name = package_dir_ + service_name_ + "Rest.php";
    f_service_rest.open(f_service_rest_name.c_str());
    generate_service_header(tservice, f_service_rest);
  }

  string extends = "";
  string extends_if = "";
  if (tservice->get_extends() != nullptr) {
    extends = " extends " + php_namespace(tservice->get_extends()->get_program())
              + tservice->get_extends()->get_name();
    extends_if = " extends " + php_namespace(tservice->get_extends()->get_program())
                 + tservice->get_extends()->get_name() + "Rest";
  }
  f_service_rest << "class " << service_name_ << "Rest" << extends_if << endl
                 << "{" << endl;
  indent_up();

  if (extends.empty()) {
    f_service_rest << indent() << "protected $impl_;" << endl << endl;
  }

  f_service_rest << indent() << "public function __construct($impl) {" << endl << indent()
             << "  $this->impl_ = $impl;" << endl << indent() << "}" << endl << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    indent(f_service_rest) << "public function " << (*f_iter)->get_name() << "($request) {" << endl;
    indent_up();
    const vector<t_field*>& args = (*f_iter)->get_arglist()->get_members();
    vector<t_field*>::const_iterator a_iter;
    for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
      t_type* atype = get_true_type((*a_iter)->get_type());
      string cast = type_to_cast(atype);
      string req = "$request['" + (*a_iter)->get_name() + "']";
      if (atype->is_bool()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = " << cast << "(!empty(" << req
                   << ") && (" << req << " !== 'false'));" << endl;
      } else {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = isset(" << req << ") ? "
                   << cast << req << " : null;" << endl;
      }
      if (atype->is_string() && ((t_base_type*)atype)->is_string_list()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = explode(',', $"
                       << (*a_iter)->get_name() << ");" << endl;
      } else if (atype->is_map() || atype->is_list()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = json_decode($"
                       << (*a_iter)->get_name() << ", true);" << endl;
      } else if (atype->is_set()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = array_fill_keys(json_decode($"
                       << (*a_iter)->get_name() << ", true), 1);" << endl;
      } else if (atype->is_struct() || atype->is_xception()) {
        f_service_rest << indent() << "if ($" << (*a_iter)->get_name() << " !== null) {" << endl
                       << indent() << "  $" << (*a_iter)->get_name() << " = new "
                       << php_namespace(atype->get_program()) << atype->get_name() << "(json_decode($"
                       << (*a_iter)->get_name() << ", true));" << endl << indent() << "}" << endl;
      }
    }
    f_service_rest << indent() << "return $this->impl_->" << (*f_iter)->get_name() << "("
               << argument_list((*f_iter)->get_arglist(), false) << ");" << endl;
    indent_down();
    indent(f_service_rest) << "}" << endl << endl;
  }
  indent_down();
  f_service_rest << "}" << endl << endl;

  // Close service rest file
  f_service_rest << endl;
  if (!classmap_) {
    f_service_rest.close();
  }
}